

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserSamTest_ParseWhole_Test::TestBody(BioparserSamTest_ParseWhole_Test *this)

{
  Parser<bioparser::test::SamOverlap> *pPVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"sample.sam",&local_31);
  BioparserSamTest::Setup(&this->super_BioparserSamTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  pPVar1 = (this->super_BioparserSamTest).p._M_t.
           super___uniq_ptr_impl<bioparser::Parser<bioparser::test::SamOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::SamOverlap>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<bioparser::test::SamOverlap>_*,_std::default_delete<bioparser::Parser<bioparser::test::SamOverlap>_>_>
           .super__Head_base<0UL,_bioparser::Parser<bioparser::test::SamOverlap>_*,_false>.
           _M_head_impl;
  (*pPVar1->_vptr_Parser[2])(&local_30,pPVar1,0xffffffffffffffff,1);
  std::
  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  ::_M_move_assign(&(this->super_BioparserSamTest).o,&local_30);
  std::
  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  ::~vector((vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
             *)&local_30);
  BioparserSamTest::Check(&this->super_BioparserSamTest);
  return;
}

Assistant:

TEST_F(BioparserSamTest, ParseWhole) {
  Setup("sample.sam");
  o = p->Parse(-1);
  Check();
}